

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperationsBuilder.cpp
# Opt level: O0

void __thiscall
Refal2::COperationsBuilder::AddMatchRight_V
          (COperationsBuilder *this,CQualifier *qualifier,bool saveInTable)

{
  bool bVar1;
  bool saveInTable_local;
  CQualifier *qualifier_local;
  COperationsBuilder *this_local;
  
  bVar1 = CQualifier::IsEmpty(qualifier);
  if (bVar1) {
    if (saveInTable) {
      addOperation_VE(this,OT_MatchRightBeginSaveToTable_V);
      addNoArgumensOperation(this,OT_MatchRightSaveToTable_E);
    }
    else {
      addOperation_VE(this,OT_MatchRightBegin_V);
      addNoArgumensOperation(this,OT_MatchRight_E);
    }
  }
  else if (saveInTable) {
    addOperation_VE(this,OT_MatchRightWithQulifierBeginSaveToTable_V,qualifier);
    addQualifierIndexOperation(this,OT_MatchRightWithQulifierSaveToTable_E,qualifier);
  }
  else {
    addOperation_VE(this,OT_MatchRightWithQulifierBegin_V,qualifier);
    addQualifierIndexOperation(this,OT_MatchRightWithQulifier_E,qualifier);
  }
  return;
}

Assistant:

void COperationsBuilder::AddMatchRight_V( CQualifier& qualifier,
	bool saveInTable )
{
	DEBUG_PRINT( __FUNCTION__ )
	if( qualifier.IsEmpty() ) {
		if( saveInTable ) {
			addOperation_VE( OT_MatchRightBeginSaveToTable_V );
			addNoArgumensOperation( OT_MatchRightSaveToTable_E );
		} else {
			addOperation_VE( OT_MatchRightBegin_V );
			addNoArgumensOperation( OT_MatchRight_E );
		}
	} else {
		if( saveInTable ) {
			addOperation_VE( OT_MatchRightWithQulifierBeginSaveToTable_V,
				qualifier );
			addQualifierIndexOperation( OT_MatchRightWithQulifierSaveToTable_E,
				qualifier );
		} else {
			addOperation_VE( OT_MatchRightWithQulifierBegin_V, qualifier );
			addQualifierIndexOperation( OT_MatchRightWithQulifier_E,
				qualifier );
		}
	}
}